

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplCyclic.cpp
# Opt level: O0

void __thiscall PimplCyclic::Cyclic::Impl::doSomething(Impl *this)

{
  char *pcVar1;
  ostream *poVar2;
  enable_shared_from_this<PimplCyclic::Cyclic::Impl> local_20;
  Impl *local_10;
  Impl *this_local;
  
  local_10 = this;
  std::enable_shared_from_this<PimplCyclic::Cyclic::Impl>::shared_from_this(&local_20);
  std::function<void()>::operator=
            ((function<void()> *)&this->_fn,(anon_class_16_1_8991873d *)&local_20);
  doSomething()::{lambda()#1}::~doSomething((_lambda___1_ *)&local_20);
  pcVar1 = std::type_info::name((type_info *)&typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,"::");
  poVar2 = std::operator<<(poVar2,"doSomething");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void doSomething()
    {
        _fn = [shis = shared_from_this()](){};

        std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
    }